

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3StrAccumAppend(StrAccum *p,char *z,int N)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *__dest;
  int nBytes;
  long lVar5;
  uint uVar6;
  
  if (p->mallocFailed != '\0' || p->tooBig != '\0') {
    return;
  }
  if (N < 0) {
    if (z == (char *)0x0) {
      N = 0;
    }
    else {
      uVar6 = 0xffffffff;
      pcVar4 = z;
      do {
        uVar6 = uVar6 + 1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
      N = uVar6 & 0x3fffffff;
    }
  }
  if (z == (char *)0x0 || N == 0) {
    return;
  }
  uVar6 = p->nChar;
  if ((int)(uVar6 + N) < p->nAlloc) goto LAB_00156113;
  if (p->useMalloc == '\0') {
    p->tooBig = '\x01';
    N = p->nAlloc + ~uVar6;
    bVar2 = 0 < N;
  }
  else {
    pcVar4 = (char *)0x0;
    if (p->zText != p->zBase) {
      pcVar4 = p->zText;
    }
    lVar5 = (ulong)(uint)N + (long)(int)uVar6 + 1;
    if (p->mxAlloc < lVar5) {
      sqlite3StrAccumReset(p);
      p->tooBig = '\x01';
    }
    else {
      nBytes = (int)lVar5;
      p->nAlloc = nBytes;
      if (p->useMalloc == '\x01') {
        __dest = (char *)sqlite3DbRealloc(p->db,pcVar4,nBytes);
      }
      else {
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          __dest = (char *)sqlite3Realloc(pcVar4,nBytes);
        }
        else {
          __dest = (char *)0x0;
        }
      }
      if (__dest != (char *)0x0) {
        if ((pcVar4 == (char *)0x0) && (0 < (long)p->nChar)) {
          memcpy(__dest,p->zText,(long)p->nChar);
        }
        p->zText = __dest;
        bVar2 = true;
        goto LAB_0015610f;
      }
      p->mallocFailed = '\x01';
      sqlite3StrAccumReset(p);
    }
    bVar2 = false;
  }
LAB_0015610f:
  if (!bVar2) {
    return;
  }
LAB_00156113:
  memcpy(p->zText + p->nChar,z,(long)N);
  p->nChar = p->nChar + N;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumAppend(StrAccum *p, const char *z, int N){
  assert( z!=0 || N==0 );
  if( p->tooBig | p->mallocFailed ){
    testcase(p->tooBig);
    testcase(p->mallocFailed);
    return;
  }
  assert( p->zText!=0 || p->nChar==0 );
  if( N<0 ){
    N = sqlite3Strlen30(z);
  }
  if( N==0 || NEVER(z==0) ){
    return;
  }
  if( p->nChar+N >= p->nAlloc ){
    char *zNew;
    if( !p->useMalloc ){
      p->tooBig = 1;
      N = p->nAlloc - p->nChar - 1;
      if( N<=0 ){
        return;
      }
    }else{
      char *zOld = (p->zText==p->zBase ? 0 : p->zText);
      i64 szNew = p->nChar;
      szNew += N + 1;
      if( szNew > p->mxAlloc ){
        sqlite3StrAccumReset(p);
        p->tooBig = 1;
        return;
      }else{
        p->nAlloc = (int)szNew;
      }
      if( p->useMalloc==1 ){
        zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
      }else{
        zNew = sqlite3_realloc(zOld, p->nAlloc);
      }
      if( zNew ){
        if( zOld==0 && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
        p->zText = zNew;
      }else{
        p->mallocFailed = 1;
        sqlite3StrAccumReset(p);
        return;
      }
    }
  }
  assert( p->zText );
  memcpy(&p->zText[p->nChar], z, N);
  p->nChar += N;
}